

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RWNode.h
# Opt level: O2

void __thiscall dg::dda::RWNode::RWNode(RWNode *this,RWNodeType t)

{
  (this->super_SubgraphNode<dg::dda::RWNode>).id = 0;
  (this->super_SubgraphNode<dg::dda::RWNode>).scc_id = 0;
  (this->super_SubgraphNode<dg::dda::RWNode>).data = (void *)0x0;
  (this->super_SubgraphNode<dg::dda::RWNode>).user_data = (void *)0x0;
  (this->super_SubgraphNode<dg::dda::RWNode>)._successors.
  super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_SubgraphNode<dg::dda::RWNode>)._successors.
  super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_SubgraphNode<dg::dda::RWNode>)._successors.
  super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_SubgraphNode<dg::dda::RWNode>)._predecessors.
  super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_SubgraphNode<dg::dda::RWNode>)._predecessors.
  super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_SubgraphNode<dg::dda::RWNode>)._predecessors.
  super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_SubgraphNode<dg::dda::RWNode>).operands.
  super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_SubgraphNode<dg::dda::RWNode>).operands.
  super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_SubgraphNode<dg::dda::RWNode>).operands.
  super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_SubgraphNode<dg::dda::RWNode>).users.
  super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_SubgraphNode<dg::dda::RWNode>).users.
  super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_SubgraphNode<dg::dda::RWNode>).users.
  super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_SubgraphNode<dg::dda::RWNode>).size = 0;
  this->_vptr_RWNode = (_func_int **)&PTR__RWNode_0012ecb8;
  this->type = t;
  this->has_address_taken = false;
  this->bblock = (RWBBlock *)0x0;
  Annotations::Annotations(&this->annotations);
  *(undefined8 *)
   ((long)&(this->defuse).defuse.
           super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->defuse).defuse.
           super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->defuse).defuse.super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->defuse).defuse.super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

RWNode(RWNodeType t = RWNodeType::NONE)
            : SubgraphNode<RWNode>(0), type(t) {}